

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.cc
# Opt level: O1

string * __thiscall
abi_test::internal::FixVAArgsString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *str)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_type *psVar7;
  string ret;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,(char *)this,(allocator<char> *)&local_b8);
  uVar2 = std::__cxx11::string::find((char)(string *)&local_78,0x2c);
  if (uVar2 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_78,local_70 + (long)local_78);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00127d54;
  }
  lVar3 = uVar2 + 1;
  do {
    if (local_70 <= uVar2 + 1) break;
    lVar1 = uVar2 + 1;
    uVar2 = uVar2 + 1;
  } while (*(char *)((long)local_78 + lVar1) == ' ');
  do {
    if (lVar3 == 1) break;
    lVar1 = lVar3 + -2;
    lVar3 = lVar3 + -1;
  } while (*(char *)((long)local_78 + lVar1) == ' ');
  std::__cxx11::string::substr((ulong)local_38,(ulong)&local_78);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_38);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_88 = *puVar6;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar6;
    local_98 = (ulong *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_78);
  uVar2 = 0xf;
  if (local_98 != &local_88) {
    uVar2 = local_88;
  }
  if (uVar2 < (ulong)(local_50 + local_90)) {
    uVar2 = 0xf;
    if (local_58 != local_48) {
      uVar2 = local_48[0];
    }
    if (uVar2 < (ulong)(local_50 + local_90)) goto LAB_00127c33;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_00127c33:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_58);
  }
  local_b8 = &local_a8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_a8 = *plVar4;
    uStack_a0 = puVar5[3];
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*puVar5;
  }
  local_b0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
LAB_00127d54:
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixVAArgsString(const char *str) {
  std::string ret = str;
  size_t idx = ret.find(',');
  if (idx == std::string::npos) {
    return ret + "()";
  }
  size_t idx2 = idx + 1;
  while (idx2 < ret.size() && ret[idx2] == ' ') {
    idx2++;
  }
  while (idx > 0 && ret[idx - 1] == ' ') {
    idx--;
  }
  return ret.substr(0, idx) + "(" + ret.substr(idx2) + ")";
}